

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Aggregate_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Aggregate_State_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pAVar3;
  pointer pEVar4;
  pointer pSVar5;
  pointer pSVar6;
  reference this_00;
  VariableDatum *pVVar7;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  string local_420 [32];
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
  local_400;
  const_iterator citrVDEnd;
  const_iterator citrVD;
  __normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
  local_3d0;
  const_iterator citrSESEnd;
  const_iterator citrSES;
  __normal_iterator<const_KDIS::DATA_TYPE::SilentAggregateSystem_*,_std::vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>_>
  local_3a0;
  const_iterator citrSASEnd;
  const_iterator citrSAS;
  __normal_iterator<const_KDIS::DATA_TYPE::EntityIdentifier_*,_std::vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>_>
  local_370;
  const_iterator citrEIEnd;
  const_iterator citrEI;
  __normal_iterator<const_KDIS::DATA_TYPE::AggregateIdentifier_*,_std::vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>_>
  local_340;
  const_iterator citrAIEnd;
  const_iterator citrAI;
  KString local_310;
  KString local_2f0;
  KString local_2d0;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Aggregate_State_PDU *local_18;
  Aggregate_State_PDU *this_local;
  
  local_18 = this;
  this_local = (Aggregate_State_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Aggregate State PDU-\n");
  poVar2 = std::operator<<(poVar2,"Aggregate ID:\n");
  DATA_TYPE::AggregateIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_AggregateID);
  UTILS::IndentString(&local_1f0,&local_210,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Force ID:                    ");
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)this->m_ui8ForceID,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Aggregate State:             ");
  DATA_TYPE::ENUMS::GetEnumAsStringAggregateState_abi_cxx11_
            (&local_250,(ENUMS *)(ulong)this->m_ui8AggState,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"\n");
  DATA_TYPE::AggregateType::GetAsString_abi_cxx11_(&local_270,&this->m_AggregateType);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  poVar2 = std::operator<<(poVar2,"Formation:                   ");
  DATA_TYPE::ENUMS::GetEnumAsStringFormation_abi_cxx11_
            (&local_290,(ENUMS *)(ulong)this->m_ui32Formation,Value_01);
  poVar2 = std::operator<<(poVar2,(string *)&local_290);
  poVar2 = std::operator<<(poVar2,"\n");
  DATA_TYPE::AggregateMarking::GetAsString_abi_cxx11_(&local_2b0,&this->m_AggregateMarking);
  poVar2 = std::operator<<(poVar2,(string *)&local_2b0);
  poVar2 = std::operator<<(poVar2,"Dimensions:                  ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_2d0,&this->m_Dimensions);
  poVar2 = std::operator<<(poVar2,(string *)&local_2d0);
  poVar2 = std::operator<<(poVar2,"Orientation:                 ");
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_2f0,&this->m_Ori);
  poVar2 = std::operator<<(poVar2,(string *)&local_2f0);
  poVar2 = std::operator<<(poVar2,"Center Of Mass:              ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_310,&this->m_CtrOfMassLoc);
  poVar2 = std::operator<<(poVar2,(string *)&local_310);
  poVar2 = std::operator<<(poVar2,"Velocity:                    ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_((KString *)&citrAI,&this->m_Vel);
  poVar2 = std::operator<<(poVar2,(string *)&citrAI);
  poVar2 = std::operator<<(poVar2,"Number Of Aggregates:        ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumAggregates);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Entities:          ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumEntities);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Silent Aggregates: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumSilentAggregateTypes);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Silent Entities    ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumSilentEntityTypes);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&citrAI);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrAIEnd = std::
              vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
              ::begin(&this->m_vAI);
  local_340._M_current =
       (AggregateIdentifier *)
       std::
       vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
       ::end(&this->m_vAI);
  while (bVar1 = __gnu_cxx::operator!=(&citrAIEnd,&local_340), bVar1) {
    pAVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::AggregateIdentifier_*,_std::vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>_>
             ::operator->(&citrAIEnd);
    (*(pAVar3->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase[2])(&citrEI);
    std::operator<<(local_190,(string *)&citrEI);
    std::__cxx11::string::~string((string *)&citrEI);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::AggregateIdentifier_*,_std::vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>_>
    ::operator++(&citrAIEnd);
  }
  citrEIEnd = std::
              vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
              ::begin(&this->m_vEI);
  local_370._M_current =
       (EntityIdentifier *)
       std::
       vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
       ::end(&this->m_vEI);
  while (bVar1 = __gnu_cxx::operator!=(&citrEIEnd,&local_370), bVar1) {
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::EntityIdentifier_*,_std::vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>_>
             ::operator->(&citrEIEnd);
    (*(pEVar4->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase[2])(&citrSAS);
    std::operator<<(local_190,(string *)&citrSAS);
    std::__cxx11::string::~string((string *)&citrSAS);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::EntityIdentifier_*,_std::vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>_>
    ::operator++(&citrEIEnd);
  }
  bVar1 = needsPadding(this);
  if (bVar1) {
    poVar2 = std::operator<<(local_190,"Padding:                 ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumberOfPaddingOctets);
    std::operator<<(poVar2," octets\n");
  }
  citrSASEnd = std::
               vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
               ::begin(&this->m_vSASL);
  local_3a0._M_current =
       (SilentAggregateSystem *)
       std::
       vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
       ::end(&this->m_vSASL);
  while (bVar1 = __gnu_cxx::operator!=(&citrSASEnd,&local_3a0), bVar1) {
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::SilentAggregateSystem_*,_std::vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>_>
             ::operator->(&citrSASEnd);
    (*(pSVar5->super_DataTypeBase)._vptr_DataTypeBase[2])(&citrSES);
    std::operator<<(local_190,(string *)&citrSES);
    std::__cxx11::string::~string((string *)&citrSES);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::SilentAggregateSystem_*,_std::vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>_>
    ::operator++(&citrSASEnd);
  }
  citrSESEnd = std::
               vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
               ::begin(&this->m_vSESL);
  local_3d0._M_current =
       (SilentEntitySystem *)
       std::
       vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
       ::end(&this->m_vSESL);
  while (bVar1 = __gnu_cxx::operator!=(&citrSESEnd,&local_3d0), bVar1) {
    pSVar6 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
             ::operator->(&citrSESEnd);
    (*(pSVar6->super_DataTypeBase)._vptr_DataTypeBase[2])(&citrVD);
    std::operator<<(local_190,(string *)&citrVD);
    std::__cxx11::string::~string((string *)&citrVD);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
    ::operator++(&citrSESEnd);
  }
  poVar2 = std::operator<<(local_190,"Number Of Variable Datums:   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui32NumVariableDatum);
  std::operator<<(poVar2,"\n");
  citrVDEnd = std::
              vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
              ::begin(&this->m_vVD);
  local_400._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
       ::end(&this->m_vVD);
  while (bVar1 = __gnu_cxx::operator!=(&citrVDEnd,&local_400), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
              ::operator*(&citrVDEnd);
    pVVar7 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::operator->(this_00);
    (*(pVVar7->super_DataTypeBase)._vptr_DataTypeBase[2])(local_420);
    std::operator<<(local_190,local_420);
    std::__cxx11::string::~string(local_420);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
    ::operator++(&citrVDEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Aggregate_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Aggregate State PDU-\n"
       << "Aggregate ID:\n"
       << IndentString( m_AggregateID.GetAsString(), 1 )
       << "Force ID:                    " << GetEnumAsStringForceID( m_ui8ForceID )         << "\n"
       << "Aggregate State:             " << GetEnumAsStringAggregateState( m_ui8AggState ) << "\n"
       << m_AggregateType.GetAsString()
       << "Formation:                   " << GetEnumAsStringFormation( m_ui32Formation )    << "\n"
       << m_AggregateMarking.GetAsString()
       << "Dimensions:                  " << m_Dimensions.GetAsString()
       << "Orientation:                 " << m_Ori.GetAsString()
       << "Center Of Mass:              " << m_CtrOfMassLoc.GetAsString()
       << "Velocity:                    " << m_Vel.GetAsString()
       << "Number Of Aggregates:        " << m_ui16NumAggregates                            << "\n"
       << "Number Of Entities:          " << m_ui16NumEntities                              << "\n"
       << "Number Of Silent Aggregates: " << m_ui16NumSilentAggregateTypes                  << "\n"
       << "Number Of Silent Entities    " << m_ui16NumSilentEntityTypes                     << "\n";

    vector<AggregateIdentifier>::const_iterator citrAI = m_vAI.begin();
    vector<AggregateIdentifier>::const_iterator citrAIEnd = m_vAI.end();
    for( ; citrAI != citrAIEnd; ++citrAI )
    {
        ss << citrAI->GetAsString();
    }

    vector<EntityIdentifier>::const_iterator citrEI = m_vEI.begin();
    vector<EntityIdentifier>::const_iterator citrEIEnd = m_vEI.end();
    for( ; citrEI != citrEIEnd; ++citrEI )
    {
        ss << citrEI->GetAsString();
    }

    if (needsPadding())
    {
        ss << "Padding:                 " << m_ui16NumberOfPaddingOctets << " octets\n";
    }

    vector<SilentAggregateSystem>::const_iterator citrSAS = m_vSASL.begin();
    vector<SilentAggregateSystem>::const_iterator citrSASEnd = m_vSASL.end();
    for( ; citrSAS != citrSASEnd; ++citrSAS )
    {
        ss << citrSAS->GetAsString();
    }

    vector<SilentEntitySystem>::const_iterator citrSES = m_vSESL.begin();
    vector<SilentEntitySystem>::const_iterator citrSESEnd = m_vSESL.end();
    for( ; citrSES != citrSESEnd; ++citrSES )
    {
        ss << citrSES->GetAsString();
    }

    ss << "Number Of Variable Datums:   " << m_ui32NumVariableDatum << "\n";

    vector<VarDtmPtr>::const_iterator citrVD = m_vVD.begin();
    vector<VarDtmPtr>::const_iterator citrVDEnd = m_vVD.end();
    for( ; citrVD != citrVDEnd; ++citrVD )
    {
        ss << ( *citrVD )->GetAsString();
    }

    return ss.str();
}